

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::Data::Create(Data *this,uint initSize,ArenaAllocator *tmpAlloc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  DataChunk *this_00;
  TrackAllocData local_48;
  ArenaAllocator *local_20;
  ArenaAllocator *tmpAlloc_local;
  Data *pDStack_10;
  uint initSize_local;
  Data *this_local;
  
  this->tempAllocator = tmpAlloc;
  local_20 = tmpAlloc;
  tmpAlloc_local._4_4_ = initSize;
  pDStack_10 = this;
  if (this->head != (DataChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xcdd,"(head == nullptr)","Missing dispose?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->currentOffset = 0;
  pAVar4 = &this->tempAllocator->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&DataChunk::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
             ,0xcdf);
  pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar4,&local_48);
  this_00 = (DataChunk *)new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar4,0x3f67b0);
  DataChunk::DataChunk(this_00,this->tempAllocator,tmpAlloc_local._4_4_);
  this->head = this_00;
  this->current = this->head;
  return;
}

Assistant:

void ByteCodeWriter::Data::Create(uint initSize, ArenaAllocator* tmpAlloc)
    {
        //
        // Allocate the initial byte-code block to write into.
        //

        tempAllocator = tmpAlloc;
        AssertMsg(head == nullptr, "Missing dispose?");
        currentOffset = 0;
        head = Anew(tempAllocator, DataChunk, tempAllocator, initSize);
        current = head;
    }